

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvf.inc.c
# Opt level: O3

_Bool trans_fclass_s(DisasContext_conflict12 *ctx,arg_fclass_s *a)

{
  TCGContext_conflict11 *s;
  TCGTemp *ret;
  uintptr_t o;
  TCGTemp *local_20;
  
  if ((ctx->mstatus_fs != 0) && ((ctx->misa & 0x20) != 0)) {
    s = ctx->uc->tcg_ctx;
    ret = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
    local_20 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_fpr[a->rs1]);
    tcg_gen_callN_riscv64(s,helper_fclass_s_riscv64,ret,1,&local_20);
    if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != (TCGv_i64)((long)ret - (long)s))) {
      tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[a->rd]),
                          (TCGArg)ret);
    }
    tcg_temp_free_internal_riscv64(s,ret);
    return true;
  }
  return false;
}

Assistant:

static bool trans_fclass_s(DisasContext *ctx, arg_fclass_s *a)
{
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVF);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv t0 = tcg_temp_new(tcg_ctx);

    gen_helper_fclass_s(tcg_ctx, t0, tcg_ctx->cpu_fpr[a->rs1]);

    gen_set_gpr(tcg_ctx, a->rd, t0);
    tcg_temp_free(tcg_ctx, t0);

    return true;
}